

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

void __thiscall Potassco::SmodelsInput::matchSum(SmodelsInput *this,RuleBuilder *rule,bool weights)

{
  Atom_t a;
  uint uVar1;
  WeightLit_t *pWVar2;
  byte in_DL;
  ProgramReader *in_RDI;
  WeightLit_t *end;
  WeightLit_t *x;
  Lit_t p;
  uint32_t i;
  uint32_t neg;
  uint32_t len;
  uint32_t bnd;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc8;
  WeightLit_t *pWVar3;
  RuleBuilder *in_stack_ffffffffffffffd0;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_18 = ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffbc,(char *)0x13a831);
  local_1c = ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffbc,(char *)0x13a84b);
  local_20 = ProgramReader::matchPos(in_RDI,in_stack_ffffffffffffffbc,(char *)0x13a865);
  if ((local_11 & 1) == 0) {
    std::swap<unsigned_int>(&local_1c,&local_18);
    std::swap<unsigned_int>(&local_18,&local_20);
  }
  RuleBuilder::startSum((RuleBuilder *)in_RDI,in_stack_ffffffffffffffbc);
  for (local_24 = 0; local_24 != local_1c; local_24 = local_24 + 1) {
    a = ProgramReader::matchAtom
                  (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    lit(a);
    if (local_20 != 0) {
      local_20 = local_20 - 1;
    }
    RuleBuilder::addGoal
              (in_stack_ffffffffffffffd0,(Lit_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
               (Weight_t)in_stack_ffffffffffffffc8);
  }
  if ((local_11 & 1) != 0) {
    pWVar2 = RuleBuilder::wlits_begin((RuleBuilder *)in_RDI);
    pWVar3 = pWVar2 + local_1c;
    for (; pWVar2 != pWVar3; pWVar2 = pWVar2 + 1) {
      uVar1 = ProgramReader::matchPos
                        (in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ));
      pWVar2->weight = uVar1;
    }
  }
  return;
}

Assistant:

void SmodelsInput::matchSum(RuleBuilder& rule, bool weights) {
	uint32_t bnd = matchPos();
	uint32_t len = matchPos();
	uint32_t neg = matchPos();
	if (!weights) { std::swap(len, bnd); std::swap(bnd, neg); }
	rule.startSum(bnd);
	for (uint32_t i = 0; i != len; ++i) {
		Lit_t p = lit(matchAtom());
		if (neg) { p *= -1; --neg; }
		rule.addGoal(p, 1);
	}
	if (weights) {
		for (WeightLit_t* x = rule.wlits_begin(), *end = x + len; x != end; ++x) {
			x->weight = (Weight_t)matchPos("non-negative weight expected");
		}
	}
}